

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test3D(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar12;
  long lVar11;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar10);
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,0x8229,8,8,8);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x502,"glTextureStorage3D",
                     "texture is not the name of an existing texture object.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,this->m_internalformat_invalid,8,8,8);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x500,"glTextureStorage3D",
                     "internalformat is not a valid sized internal format.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,0x8229,8,8,8);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x500,"glTextureStorage3D",
                     "the effective target of texture is not one of the accepted targets.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,0,0x8229,8,8,8);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage3D",
                     "levels is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,0x8229,0,8,8);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage3D",
                     "width is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,0x8229,8,0,8);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage3D",
                     "height is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,1,0x8229,8,8,0);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage3D",
                     "depth is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_3D;
  (**(code **)(lVar11 + 0x1468))(pEVar12,8,0x8229,8,8,8);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x502,"glTextureStorage3D",
                     "target is TEXTURE_3D and levels is greater than log2(max(width, height, depth))+1."
                    );
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_array;
  (**(code **)(lVar11 + 0x1468))(pEVar12,6,0x8229,8,8,0x100);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x502,"glTextureStorage3D",
                     "target is TEXTURE_2D_ARRAY and levels is greater than log2(max(width, height))+1."
                    );
  return (bVar9 && bVar8) && ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)))
  ;
}

Assistant:

bool StorageErrorsTest::Test3D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage3D if texture
	 is not the name of an existing texture object. */
	{
		gl.textureStorage3D(m_to_invalid, 1, GL_R8, 8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage3D",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage3D if
	 internalformat is not a valid sized internal format. */
	{
		gl.textureStorage3D(m_to_3D, 1, m_internalformat_invalid, 8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage3D",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage3D if target or
	 the effective target of texture is not one of the accepted targets
	 described above. */
	{
		gl.textureStorage3D(m_to_1D, 1, GL_R8, 8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage3D",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/*  Check that INVALID_VALUE is generated by TextureStorage3D if width,
	 height, depth or levels are less than 1. */
	{
		gl.textureStorage3D(m_to_3D, 0, GL_R8, 8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3D", "levels is less than 1.");

		gl.textureStorage3D(m_to_3D, 1, GL_R8, 0, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3D", "width is less than 1.");

		gl.textureStorage3D(m_to_3D, 1, GL_R8, 8, 0, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3D", "height is less than 1.");

		gl.textureStorage3D(m_to_3D, 1, GL_R8, 8, 8, 0);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage3D", "depth is less than 1.");
	}

	/* Check that INVALID_OPERATION is generated by TextureStorage3D if target
	 is TEXTURE_3D or PROXY_TEXTURE_3D and levels is greater than
	 log2(max(width, height, depth))+1. */
	{
		gl.textureStorage3D(m_to_3D, 8, GL_R8, 8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage3D",
								  "target is TEXTURE_3D and levels is greater than log2(max(width, height, depth))+1.");
	}

	/*  Check that INVALID_OPERATION is generated by TextureStorage3D if target
	 is TEXTURE_2D_ARRAY, PROXY_TEXTURE_2D_ARRAY, TEXURE_CUBE_ARRAY,
	 or PROXY_TEXTURE_CUBE_MAP_ARRAY and levels is greater than
	 log2(max(width, height))+1.  */
	{
		gl.textureStorage3D(m_to_2D_array, 6, GL_R8, 8, 8, 256);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage3D",
								  "target is TEXTURE_2D_ARRAY and levels is greater than log2(max(width, height))+1.");
	}

	return is_ok;
}